

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

_Bool mpack_node_bool(mpack_node_t node)

{
  if ((node.tree)->error != mpack_ok) {
    return false;
  }
  if ((node.data)->type == mpack_type_bool) {
    return ((node.data)->value).b;
  }
  mpack_tree_flag_error(node.tree,mpack_error_type);
  return false;
}

Assistant:

MPACK_INLINE bool mpack_node_bool(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return false;

    if (node.data->type == mpack_type_bool)
        return node.data->value.b;

    mpack_node_flag_error(node, mpack_error_type);
    return false;
}